

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O3

void __thiscall KDIS::NETWORK::Connection::SetBlockingModeEnabled(Connection *this,KBOOL E)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  KException *this_00;
  int *piVar4;
  KCHAR8 *__s;
  bool bVar5;
  Connection *this_01;
  KINT32 uliIoctBlock;
  allocator<char> local_3d;
  uint local_3c;
  KString local_38;
  
  this->m_bBlockingSocket = E;
  lVar3 = 0;
  bVar1 = true;
  do {
    bVar5 = bVar1;
    local_3c = this->m_bBlockingSocket ^ 1;
    iVar2 = fcntl(this->m_iSocket[lVar3],4,0x2800,&local_3c);
    if (iVar2 == -1) {
      this_01 = (Connection *)0x30;
      this_00 = (KException *)__cxa_allocate_exception();
      piVar4 = __errno_location();
      __s = getErrorText(this_01,*piVar4);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_3d);
      KException::KException(this_00,&local_38,0xc);
      __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
    }
    lVar3 = 1;
    bVar1 = false;
  } while (bVar5);
  return;
}

Assistant:

void Connection::SetBlockingModeEnabled( KBOOL E )
{
    m_bBlockingSocket = E;

    for( KINT8 i = 0; i < 2; ++i )
    {
        KINT32 iResult;

#if defined( WIN32 ) | defined( _WIN32 ) | defined( WIN64 ) | defined( _WIN64 )

        // Windows non blocking //
        unsigned long int uliIoctBlock = !m_bBlockingSocket;           // 1 enable, 0 disable.
        iResult = ioctlsocket( m_iSocket[i], FIONBIO, &uliIoctBlock ); // FIONBIO =  blocking mode

#else

        // Linux non blocking //
        KINT32 uliIoctBlock = !m_bBlockingSocket; // 1 enable, 0 disable.
        iResult = fcntl( m_iSocket[i], F_SETFL, O_NONBLOCK | FASYNC, &uliIoctBlock );

#endif

        if( iResult == SOCKET_ERROR )
        {
            THROW_ERROR;
        }
    }
}